

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::SetHoleState(Clipper *this,TEdge *e,OutRec *outRec)

{
  bool bVar1;
  
  bVar1 = false;
  while (e = e->prevInAEL, e != (TEdge *)0x0) {
    if (-1 < (long)e->outIdx) {
      bVar1 = (bool)(bVar1 ^ 1);
      if (outRec->FirstLeft == (OutRec *)0x0) {
        outRec->FirstLeft =
             (this->m_PolyOuts).
             super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl
             .super__Vector_impl_data._M_start[e->outIdx];
      }
    }
  }
  if (bVar1) {
    outRec->isHole = true;
  }
  return;
}

Assistant:

void Clipper::SetHoleState(TEdge *e, OutRec *outRec)
{
  bool isHole = false;
  TEdge *e2 = e->prevInAEL;
  while (e2)
  {
    if (e2->outIdx >= 0)
    {
      isHole = !isHole;
      if (! outRec->FirstLeft)
        outRec->FirstLeft = m_PolyOuts[e2->outIdx];
    }
    e2 = e2->prevInAEL;
  }
  if (isHole) outRec->isHole = true;
}